

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:557:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:557:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  pointer pvVar1;
  uint32_t uVar2;
  value *v;
  gc_heap_ptr_untyped *this_00;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  uint32_t index;
  pointer pvVar6;
  value *l;
  value local_88;
  wstring_view local_60;
  undefined1 local_50 [16];
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
  local_50._0_8_ = (gc_heap *)0x6;
  local_50._8_8_ = L"length";
  (**(code **)*puVar3)(&local_88,puVar3);
  uVar2 = to_uint32(&local_88);
  value::~value(&local_88);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pvVar6 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
    plVar4 = (long *)gc_heap_ptr_untyped::get(this_00);
    index_string_abi_cxx11_((wstring *)&local_88,(mjs *)(ulong)uVar2,index);
    local_60._M_len = (size_t)local_88.field_1.n_;
    local_60._M_str = (wchar_t *)local_88._0_8_;
    string::string((string *)local_50,h,&local_60);
    (**(code **)(*plVar4 + 8))(plVar4,(gc_heap_ptr_untyped *)local_50,pvVar6,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_88);
    uVar2 = uVar2 + 1;
  }
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = (double)uVar2;
  plVar4 = (long *)gc_heap_ptr_untyped::get(this_00);
  plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar5 + 0x98))(&local_88,plVar5,"length");
  (**(code **)(*plVar4 + 8))(plVar4,&local_88,__return_storage_ptr__,0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }